

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

void __thiscall HFactor::setInvert(HFactor *this,InvertibleRepresentation *invert)

{
  std::vector<int,_std::allocator<int>_>::operator=(&this->l_pivot_index,&invert->l_pivot_index);
  std::vector<int,_std::allocator<int>_>::operator=(&this->l_pivot_lookup,&invert->l_pivot_lookup);
  std::vector<int,_std::allocator<int>_>::operator=(&this->l_start,&invert->l_start);
  std::vector<int,_std::allocator<int>_>::operator=(&this->l_index,&invert->l_index);
  std::vector<double,_std::allocator<double>_>::operator=(&this->l_value,&invert->l_value);
  std::vector<int,_std::allocator<int>_>::operator=(&this->lr_start,&invert->lr_start);
  std::vector<int,_std::allocator<int>_>::operator=(&this->lr_index,&invert->lr_index);
  std::vector<double,_std::allocator<double>_>::operator=(&this->lr_value,&invert->lr_value);
  std::vector<int,_std::allocator<int>_>::operator=(&this->u_pivot_lookup,&invert->u_pivot_lookup);
  std::vector<int,_std::allocator<int>_>::operator=(&this->u_pivot_index,&invert->u_pivot_index);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->u_pivot_value,&invert->u_pivot_value);
  std::vector<int,_std::allocator<int>_>::operator=(&this->u_start,&invert->u_start);
  std::vector<int,_std::allocator<int>_>::operator=(&this->u_last_p,&invert->u_last_p);
  std::vector<int,_std::allocator<int>_>::operator=(&this->u_index,&invert->u_index);
  std::vector<double,_std::allocator<double>_>::operator=(&this->u_value,&invert->u_value);
  std::vector<int,_std::allocator<int>_>::operator=(&this->ur_start,&invert->ur_start);
  std::vector<int,_std::allocator<int>_>::operator=(&this->ur_lastp,&invert->ur_lastp);
  std::vector<int,_std::allocator<int>_>::operator=(&this->ur_space,&invert->ur_space);
  std::vector<int,_std::allocator<int>_>::operator=(&this->ur_index,&invert->ur_index);
  std::vector<double,_std::allocator<double>_>::operator=(&this->ur_value,&invert->ur_value);
  std::vector<int,_std::allocator<int>_>::operator=(&this->pf_start,&invert->pf_start);
  std::vector<int,_std::allocator<int>_>::operator=(&this->pf_index,&invert->pf_index);
  std::vector<double,_std::allocator<double>_>::operator=(&this->pf_value,&invert->pf_value);
  std::vector<int,_std::allocator<int>_>::operator=(&this->pf_pivot_index,&invert->pf_pivot_index);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->pf_pivot_value,&invert->pf_pivot_value);
  return;
}

Assistant:

void HFactor::setInvert(const InvertibleRepresentation& invert) {
  this->l_pivot_index = invert.l_pivot_index;
  this->l_pivot_lookup = invert.l_pivot_lookup;
  this->l_start = invert.l_start;
  this->l_index = invert.l_index;
  this->l_value = invert.l_value;
  this->lr_start = invert.lr_start;
  this->lr_index = invert.lr_index;
  this->lr_value = invert.lr_value;

  this->u_pivot_lookup = invert.u_pivot_lookup;
  this->u_pivot_index = invert.u_pivot_index;
  this->u_pivot_value = invert.u_pivot_value;
  this->u_start = invert.u_start;
  this->u_last_p = invert.u_last_p;
  this->u_index = invert.u_index;
  this->u_value = invert.u_value;

  this->ur_start = invert.ur_start;
  this->ur_lastp = invert.ur_lastp;
  this->ur_space = invert.ur_space;
  this->ur_index = invert.ur_index;
  this->ur_value = invert.ur_value;
  this->pf_start = invert.pf_start;
  this->pf_index = invert.pf_index;
  this->pf_value = invert.pf_value;
  this->pf_pivot_index = invert.pf_pivot_index;
  this->pf_pivot_value = invert.pf_pivot_value;
}